

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

int scanPastString(char *buffer,int buffer_len,int offset,int *lines)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int start;
  char *buffer_00;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  char term;
  int delimlen;
  int clean;
  char *delim;
  bool saw8;
  bool prefix;
  int explore;
  bool israw;
  int extralines;
  int matchlen;
  anon_class_1_0_00000001 isDigit;
  undefined8 in_stack_ffffffffffffff98;
  uchar c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffaf;
  int local_38;
  int local_28;
  int local_18;
  int local_14;
  int local_10;
  undefined1 local_9;
  long local_8;
  
  c = (uchar)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = false;
  if (0 < in_EDX) {
    if (in_RDI[in_EDX] == '\"') {
      local_38 = in_EDX + -1;
      bVar2 = false;
      bVar3 = false;
      while (-1 < local_38) {
        if (((local_38 < 1) || ((in_RDI[local_38] != '\r' && (in_RDI[local_38] != '\n')))) ||
           (in_RDI[local_38 + -1] != '\\')) {
          if ((((local_38 < 2) || (in_RDI[local_38] != '\n')) || (in_RDI[local_38 + -1] != '\r')) ||
             (in_RDI[local_38 + -2] != '\\')) {
            if ((bVar3) && (in_RDI[local_38] == 'u')) {
              bVar3 = false;
              bVar2 = true;
            }
            else {
              if ((bVar3) || (bVar2)) break;
              if ((local_38 < 2) || (in_RDI[local_38] != '8')) {
                if ((in_RDI[local_38] == 'L') ||
                   ((in_RDI[local_38] == 'U' || (in_RDI[local_38] == 'u')))) {
                  bVar2 = true;
                }
                else {
                  if ((in_RDI[local_38] != 'R') || (bVar5)) break;
                  bVar5 = true;
                }
              }
              else {
                bVar3 = true;
              }
            }
            local_38 = local_38 + -1;
          }
          else {
            local_38 = local_38 + -3;
          }
        }
        else {
          local_38 = local_38 + -2;
        }
      }
      if (((bVar5) && (-1 < local_38)) &&
         ((iVar4 = isalnum((int)in_RDI[local_38]), iVar4 != 0 || (in_RDI[local_38] == '_')))) {
        bVar5 = false;
      }
    }
    else {
      local_9 = 0xaa;
      iVar4 = scanPastString::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),c);
      if ((((iVar4 != 0) && (in_EDX + 1 < in_ESI)) &&
          (iVar4 = scanPastString::anon_class_1_0_00000001::operator()
                             ((anon_class_1_0_00000001 *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),c),
          iVar4 != 0)) &&
         (((local_18 = in_EDX, in_EDX < 2 || (in_RDI[in_EDX + -1] != '8')) ||
          (in_RDI[in_EDX + -2] != 'u')))) goto LAB_001d40df;
    }
  }
  if (bVar5) {
    iVar4 = skipEscapedLineEnds(in_RDI,in_ESI,in_EDX + 1,in_RCX);
    buffer_00 = in_RDI + iVar4;
    local_28 = iVar4;
    while( true ) {
      bVar5 = false;
      if (local_28 < in_ESI) {
        bVar5 = in_RDI[local_28] != '(';
      }
      if (!bVar5) break;
      if (iVar4 < local_28) {
        in_RDI[iVar4] = in_RDI[local_28];
      }
      iVar4 = iVar4 + 1;
      local_28 = skipEscapedLineEnds(in_RDI,in_ESI,local_28 + 1,in_RCX);
    }
    start = ((int)in_RDI + iVar4) - (int)buffer_00;
    uVar6 = 0;
    local_10 = start;
LAB_001d3f0f:
    local_14 = 0;
    local_28 = skipEscapedLineEnds(in_RDI,in_ESI,local_28 + 1,in_RCX);
    bVar5 = false;
    if ((local_28 < in_ESI) && (bVar5 = true, in_RDI[local_28] == ')')) {
      if (0 < start) {
        bVar3 = matchWhileUnsplitting
                          (buffer_00,iVar4,start,
                           (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                            CONCAT16(uVar6,(uint6)CONCAT14(1,
                                                  in_stack_ffffffffffffffa8))),
                           in_stack_ffffffffffffffa4,&local_14,in_RCX);
        bVar5 = true;
        if (!bVar3) goto LAB_001d3fc4;
      }
      bVar5 = in_RDI[local_28 + 1 + local_10] != '\"';
    }
LAB_001d3fc4:
    if (bVar5) {
      if ((in_RDI[local_28] == '\r') || (in_RDI[local_28] == '\n')) {
        *in_RCX = *in_RCX + 1;
      }
      goto LAB_001d3f0f;
    }
    *in_RCX = local_14 + *in_RCX;
    iVar4 = local_10 + 1 + local_28;
  }
  else {
    cVar1 = in_RDI[in_EDX];
    local_28 = in_EDX;
    while( true ) {
      iVar4 = local_28 + 1;
      bVar5 = false;
      if (iVar4 < in_ESI) {
        bVar5 = in_RDI[iVar4] != cVar1;
      }
      if (!bVar5) break;
      if (in_RDI[iVar4] == '\\') {
        local_28 = local_28 + 2;
      }
      else {
        local_28 = iVar4;
        if ((in_RDI[iVar4] == '\r') || (in_RDI[iVar4] == '\n')) {
          *in_RCX = *in_RCX + 1;
        }
      }
    }
  }
  local_28 = iVar4;
  local_18 = local_28;
LAB_001d40df:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

static int scanPastString(char *buffer, int buffer_len, int offset, int *lines)
{
    // http://en.cppreference.com/w/cpp/language/string_literal
    // It might be a C++11 raw string.
    bool israw = false;

    Q_ASSERT(offset < buffer_len);
    if (offset <= 0) {
        // skip, neither of these special cases applies here
    } else if (buffer[offset] == '"') {
        int explore = offset - 1;
        bool prefix = false; // One of L, U, u or u8 may appear before R
        bool saw8 = false; // Partial scan of u8
        while (explore >= 0) {
            // Cope with backslash-newline interruptions of the prefix:
            if (explore > 0
                && qmake_endOfLine(buffer[explore])
                && buffer[explore - 1] == '\\') {
                explore -= 2;
            } else if (explore > 1
                       && buffer[explore] == '\n'
                       && buffer[explore - 1] == '\r'
                       && buffer[explore - 2] == '\\') {
                explore -= 3;
                // Remaining cases can only decrement explore by one at a time:
            } else if (saw8 && buffer[explore] == 'u') {
                explore--;
                saw8 = false;
                prefix = true;
            } else if (saw8 || prefix) {
                break;
            } else if (explore > 1 && buffer[explore] == '8') {
                explore--;
                saw8 = true;
            } else if (buffer[explore] == 'L'
                       || buffer[explore] == 'U'
                       || buffer[explore] == 'u') {
                explore--;
                prefix = true;
            } else if (buffer[explore] == 'R') {
                if (israw)
                    break;
                explore--;
                israw = true;
            } else {
                break;
            }
        }
        // Check the R (with possible prefix) isn't just part of an identifier:
        if (israw && explore >= 0
            && (isalnum(buffer[explore]) || buffer[explore] == '_')) {
            israw = false;
        }

    } else {
        // Is this apostrophe a digit separator rather than the start of a
        // character literal ? If so, there was no string to scan past, so
        // treat the apostrophe as both open and close.
        Q_ASSERT(buffer[offset] == '\'' && offset > 0);
        // Wrap std::isdigit() to package the casting to unsigned char.
        const auto isDigit = [](unsigned char c) { return std::isdigit(c); };
        if (isDigit(buffer[offset - 1]) && offset + 1 < buffer_len && isDigit(buffer[offset + 1])) {
            // One exception: u8'0' is a perfectly good character literal.
            if (offset < 2 || buffer[offset - 1] != '8' || buffer[offset - 2] != 'u')
                return offset;
        }
    }

    if (israw) {
#define SKIP_BSNL(pos) skipEscapedLineEnds(buffer, buffer_len, (pos), lines)

        offset = SKIP_BSNL(offset + 1);
        const char *const delim = buffer + offset;
        int clean = offset;
        while (offset < buffer_len && buffer[offset] != '(') {
            if (clean < offset)
                buffer[clean++] = buffer[offset];
            else
                clean++;

            offset = SKIP_BSNL(offset + 1);
        }
        /*
          Not checking correctness (trust real compiler to do that):
          - no controls, spaces, '(', ')', '\\' or (presumably) '"' in delim;
          - at most 16 bytes in delim

          Raw strings are surely defined after phase 2, when BSNLs are resolved;
          so the delimiter's exclusion of '\\' and space (including newlines)
          applies too late to save us the need to cope with BSNLs in it.
        */

        const int delimlen = buffer + clean - delim;
        int matchlen = delimlen, extralines = 0;
        while ((offset = SKIP_BSNL(offset + 1)) < buffer_len
               && (buffer[offset] != ')'
                   || (delimlen > 0 &&
                       !matchWhileUnsplitting(buffer, buffer_len,
                                              offset + 1, delim, delimlen,
                                              &matchlen, &extralines))
                   || buffer[offset + 1 + matchlen] != '"')) {
            // skip, but keep track of lines
            if (qmake_endOfLine(buffer[offset]))
                ++*lines;
            extralines = 0;
        }
        *lines += extralines; // from the match
        // buffer[offset] is ')'
        offset += 1 + matchlen; // 1 for ')', then delim
        // buffer[offset] is '"'

#undef SKIP_BSNL
    } else { // Traditional string or char literal:
        const char term = buffer[offset];
        while (++offset < buffer_len && buffer[offset] != term) {
            if (buffer[offset] == '\\')
                ++offset;
            else if (qmake_endOfLine(buffer[offset]))
                ++*lines;
        }
    }

    return offset;
}